

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O2

Relations * __thiscall dg::vr::Relations::addImplied(Relations *this)

{
  uint uVar1;
  Relations *pRVar2;
  ulong uVar3;
  
  uVar3 = (this->bits).super__Base_bitset<1UL>._M_w;
  if ((uVar3 & 1) != 0) {
    pRVar2 = sle(this);
    pRVar2 = ule(pRVar2);
    pRVar2 = sge(pRVar2);
    uge(pRVar2);
    uVar3 = (this->bits).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 & 8) != 0) {
    pRVar2 = sle(this);
    ne(pRVar2);
    uVar3 = (this->bits).super__Base_bitset<1UL>._M_w;
  }
  uVar1 = (uint)uVar3;
  if ((uVar3 & 0x20) != 0) {
    pRVar2 = ule(this);
    ne(pRVar2);
    uVar1 = (uint)(this->bits).super__Base_bitset<1UL>._M_w;
  }
  if ((char)uVar1 < '\0') {
    pRVar2 = sge(this);
    ne(pRVar2);
    uVar1 = (uint)(this->bits).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    pRVar2 = uge(this);
    ne(pRVar2);
  }
  return this;
}

Assistant:

Relations &Relations::addImplied() {
    if (has(EQ))
        sle().ule().sge().uge();
    if (has(SLT))
        sle().ne();
    if (has(ULT))
        ule().ne();
    if (has(SGT))
        sge().ne();
    if (has(UGT))
        uge().ne();
    return *this;
}